

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O0

void __thiscall
fmt::v11::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
::put_newline<fmt::v11::basic_appender<char>>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
           *this,basic_appender<char> inserter,size_t pos)

{
  format_args args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_RDX;
  basic_appender<char> in_RSI;
  basic_appender<char> *in_RDI;
  basic_string_view<char> bVar1;
  int unused;
  string_view sv;
  undefined8 in_stack_fffffffffffffe98;
  char c;
  basic_string_view<char> *pbVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffffeb0;
  basic_string_view<char> local_148;
  basic_appender<char> local_138;
  basic_appender<char> *out;
  string_view in_stack_fffffffffffffef0;
  undefined8 uVar3;
  format_string_checker<char,_1,_0,_false> local_b0;
  char *local_70;
  size_t local_68;
  int local_60 [2];
  basic_string_view<char> local_58;
  undefined1 *local_40;
  basic_string_view<char> *local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_8;
  
  c = (char)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  out = in_RDI;
  local_138 = basic_appender<char>::operator++((basic_appender<char> *)&stack0xfffffffffffffee0,0);
  basic_appender<char>::operator*(&local_138);
  basic_appender<char>::operator=(in_RDI,c);
  if (((ulong)in_RDI->container & 0x100000000) != 0) {
    formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
    ::put_newline<fmt::v11::basic_appender<char>_>::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffeb0);
    pbVar2 = &local_148;
    local_40 = &stack0xfffffffffffffeb7;
    local_38 = pbVar2;
    bVar1 = v11::operator()((FMT_COMPILE_STRING *)0x12aa94);
    *pbVar2 = bVar1;
    local_58 = v11::operator()((FMT_COMPILE_STRING *)0x12aaaf);
    local_70 = local_58.data_;
    local_68 = local_58.size_;
    detail::format_string_checker<char,1,0,false>::format_string_checker<unsigned_long&>
              (&local_b0,local_58.data_,local_58.size_);
    bVar1.size_ = (size_t)in_RSI.container;
    bVar1.data_ = (char *)out;
    detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              (bVar1,(format_string_checker<char,_1,_0,_false> *)in_RDX.values_);
    local_60[0] = 0;
    detail::ignore_unused<int>(local_60);
    local_28 = &stack0xfffffffffffffee8;
    local_18 = &stack0xfffffffffffffef8;
    local_20 = &stack0xfffffffffffffee8;
    uVar3 = 4;
    args.field_1.values_ = in_RDX.values_;
    args.desc_ = (unsigned_long_long)in_RSI.container;
    local_8 = local_28;
    vformat_to<fmt::v11::basic_appender<char>_&,_0>(out,in_stack_fffffffffffffef0,args);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos) const {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions) {
            spdlog::fmt_lib::format_to(inserter, SPDLOG_FMT_STRING("{:04X}: "), pos);
        }
    }